

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::AssocArrayDeleteMethod::bindArgument
          (AssocArrayDeleteMethod *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax
          ,Args *args)

{
  Type *pTVar1;
  Expression *pEVar2;
  size_t in_RCX;
  SystemSubroutine *in_RDX;
  long in_RSI;
  ASTContext *in_R8;
  Type *indexType;
  Type *in_stack_00000050;
  bitmask<slang::ast::VariableFlags> in_stack_0000005e;
  Type *in_stack_ffffffffffffffa8;
  Args *in_stack_ffffffffffffffc0;
  ExpressionSyntax *in_stack_ffffffffffffffc8;
  
  if (in_RSI == 1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_R8,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xadc7c9);
    pTVar1 = Type::getAssociativeIndexType(in_stack_ffffffffffffffa8);
    if (pTVar1 != (Type *)0x0) {
      memset(&stack0xffffffffffffffc6,0,2);
      bitmask<slang::ast::VariableFlags>::bitmask
                ((bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffc6);
      pEVar2 = Expression::bindArgument
                         (in_stack_00000050,this._4_4_,in_stack_0000005e,
                          (ExpressionSyntax *)argIndex,context);
      return pEVar2;
    }
    in_stack_ffffffffffffffc8 = (ExpressionSyntax *)0x0;
  }
  pEVar2 = SystemSubroutine::bindArgument
                     (in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  return pEVar2;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        // Argument type comes from the index type of the previous argument.
        if (argIndex == 1) {
            auto indexType = args[0]->type->getAssociativeIndexType();
            if (indexType) {
                return Expression::bindArgument(*indexType, ArgumentDirection::In, {}, syntax,
                                                context);
            }
        }

        return SystemSubroutine::bindArgument(argIndex, context, syntax, args);
    }